

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::Vec3>
          (BinBinaryReader *this,Vec3 *value)

{
  char **ppcVar1;
  ulong *puVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  
  puVar2 = (ulong *)(this->reader).cur_;
  pcVar3 = (this->reader).cap_;
  if (pcVar3 < (char *)((long)puVar2 + 0xcU)) {
    bVar4 = fail_msg(this,"reader.read(value.value)",(this->reader).cur_);
    uVar5 = (ulong)bVar4;
  }
  else {
    (value->value)._M_elems[2] = *(float *)(puVar2 + 1);
    uVar5 = *puVar2;
    *(ulong *)(value->value)._M_elems = uVar5;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 0xc;
  }
  return (bool)((char *)((long)puVar2 + 0xcU) <= pcVar3 | (byte)uVar5 & 1);
}

Assistant:

bool read(std::array<T, SIZE>& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) * SIZE > cap_) {
                return false;
            }
            memcpy(value.data(), cur_, sizeof(T) * SIZE);
            cur_ += sizeof(T) * SIZE;
            return true;
        }